

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_RetFindSources(Wln_Ret_t *p)

{
  Wln_Ntk_t *pWVar1;
  int iObj;
  int iVar2;
  
  (p->vSources).nSize = 0;
  pWVar1 = p->pNtk;
  iVar2 = pWVar1->nTravIds;
  pWVar1->nTravIds = iVar2 + 1;
  if (iVar2 == 0) {
    Vec_IntFill(&pWVar1->vTravIds,(pWVar1->vTypes).nCap,0);
  }
  for (iVar2 = 0; iVar2 < (p->vSinks).nSize; iVar2 = iVar2 + 1) {
    iObj = Vec_IntEntry(&p->vSinks,iVar2);
    Wln_RetFindSources_rec(p,iObj);
  }
  return;
}

Assistant:

void Wln_RetFindSources( Wln_Ret_t * p )
{
    int i, iObj;
    Vec_IntClear( &p->vSources );
    Wln_NtkIncrementTravId( p->pNtk );
    Vec_IntForEachEntry( &p->vSinks, iObj, i )
        Wln_RetFindSources_rec( p, iObj );

//    printf( "Sources: " );
//    Vec_IntPrint( &p->vSources );
}